

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

void __thiscall
density::
heter_queue<density::runtime_type<density::feature_list<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density_tests::feature_call_update>_>,_density::basic_default_allocator<65536UL>_>
::clear(heter_queue<density::runtime_type<density::feature_list<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density_tests::feature_call_update>_>,_density::basic_default_allocator<65536UL>_>
        *this)

{
  bool bVar1;
  undefined1 local_20 [8];
  consume_operation consume;
  heter_queue<density::runtime_type<density::feature_list<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density_tests::feature_call_update>_>,_density::basic_default_allocator<65536UL>_>
  *this_local;
  
  consume.m_control = (ControlBlock *)this;
  consume_operation::consume_operation((consume_operation *)local_20);
  while (bVar1 = try_start_consume(this,(consume_operation *)local_20), bVar1) {
    consume_operation::commit((consume_operation *)local_20);
  }
  bVar1 = empty(this);
  if (!bVar1) {
    density_tests::detail::assert_failed<>("empty()",anon_var_dwarf_12e55,0x1e8);
  }
  clean_dead_elements(this);
  consume_operation::~consume_operation((consume_operation *)local_20);
  return;
}

Assistant:

void clear() noexcept
        {
            consume_operation consume;
            while (try_start_consume(consume))
            {
                consume.commit();
            }

            DENSITY_ASSERT_INTERNAL(empty());

            clean_dead_elements();
        }